

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsNotTrue(Expr *pExpr)

{
  char *in_RDI;
  long in_FS_OFFSET;
  Expr *unaff_retaddr;
  int v;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  int iVar2;
  int *pValue;
  
  pValue = *(int **)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 'z') {
    iVar1 = 1;
  }
  else {
    if (*in_RDI == -0x55) {
      iVar1 = sqlite3ExprTruthValue((Expr *)0x1d15ef);
      if (iVar1 == 0) {
        iVar1 = 1;
        goto LAB_001d1637;
      }
    }
    iVar2 = 1;
    iVar1 = sqlite3ExprIsInteger
                      (unaff_retaddr,pValue,(Parse *)CONCAT44(1,in_stack_fffffffffffffff0));
    if ((iVar1 == 0) || (iVar2 != 0)) {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
LAB_001d1637:
  if (*(int **)(in_FS_OFFSET + 0x28) == pValue) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3ExprIsNotTrue(Expr *pExpr){
  int v;
  if( pExpr->op==TK_NULL ) return 1;
  if( pExpr->op==TK_TRUEFALSE && sqlite3ExprTruthValue(pExpr)==0 ) return 1;
  v = 1;
  if( sqlite3ExprIsInteger(pExpr, &v, 0) && v==0 ) return 1;
  return 0;
}